

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

SharedOptPtr __thiscall
Potassco::ProgramOptions::anon_unknown_15::DefaultContext::getOption
          (DefaultContext *this,int param_1,char *tok)

{
  code *pcVar1;
  char cVar2;
  char *in_RCX;
  undefined4 in_register_00000034;
  long *plVar3;
  string optName;
  allocator local_69;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  plVar3 = (long *)CONCAT44(in_register_00000034,param_1);
  local_60 = 0;
  local_58[0] = 0;
  pcVar1 = (code *)plVar3[1];
  local_68 = local_58;
  if (pcVar1 != (code *)0x0) {
    std::__cxx11::string::string((string *)local_48,in_RCX,&local_69);
    cVar2 = (*pcVar1)(local_48,&local_68);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    if (cVar2 != '\0') {
      (**(code **)(*plVar3 + 0x10))(this,plVar3,local_68,3);
      goto LAB_00198223;
    }
  }
  (**(code **)(*plVar3 + 0x10))(this,plVar3,"Positional Option",3);
LAB_00198223:
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return (SharedOptPtr)(Option *)this;
}

Assistant:

SharedOptPtr  getOption(int, const char* tok) {
		std::string optName;
		if (!posOpt || !posOpt(tok, optName)) { return getOption("Positional Option", OptionContext::find_name_or_prefix); }
		return getOption(optName.c_str(), OptionContext::find_name_or_prefix);
	}